

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O2

size_t __thiscall
FlatFileSeq::Allocate(FlatFileSeq *this,FlatFilePos *pos,size_t add_size,bool *out_of_space)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  string_view source_file;
  bool bVar4;
  FILE *__stream;
  Logger *pLVar5;
  size_t additional_bytes;
  ulong uVar6;
  int *args_2;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  size_t new_size;
  string local_68;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *out_of_space = false;
  uVar6 = (ulong)pos->nPos;
  uVar2 = this->m_chunk_size;
  args_2 = (int *)(uVar6 + uVar2);
  additional_bytes = 0;
  uVar3 = ((long)args_2 + (add_size - 1)) / uVar2;
  if ((uint)(((uVar6 + uVar2) - 1) / uVar2) < (uint)uVar3) {
    new_size = (uVar3 & 0xffffffff) * uVar2;
    additional_bytes = new_size - uVar6;
    bVar4 = CheckDiskSpace(&this->m_dir,additional_bytes);
    if (bVar4) {
      __stream = (FILE *)Open(this,pos,false);
      if (__stream != (FILE *)0x0) {
        pLVar5 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,VALIDATION,Debug);
        if (bVar4) {
          pLVar5 = LogInstance();
          bVar4 = BCLog::Logger::Enabled(pLVar5);
          if (bVar4) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<unsigned_long,char_const*,int>
                      (&local_68,(tinyformat *)"Pre-allocating up to position 0x%x in %s%05u.dat\n",
                       (char *)&new_size,(unsigned_long *)&this->m_prefix,(char **)pos,args_2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,&local_68);
            std::__cxx11::string::~string((string *)&local_68);
            pLVar5 = LogInstance();
            local_68._M_dataplus._M_p = (pointer)0x55;
            local_68._M_string_length = 0x6e0e9a;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp"
            ;
            source_file._M_len = 0x55;
            str._M_str = log_msg._M_dataplus._M_p;
            str._M_len = log_msg._M_string_length;
            logging_function._M_str = "Allocate";
            logging_function._M_len = 8;
            BCLog::Logger::LogPrintStr
                      (pLVar5,str,logging_function,source_file,0x45,VALIDATION,Debug);
            std::__cxx11::string::~string((string *)&log_msg);
          }
        }
        AllocateFileRange((FILE *)__stream,pos->nPos,(uint)additional_bytes);
        fclose(__stream);
        goto LAB_003bdb3d;
      }
    }
    else {
      *out_of_space = true;
    }
    additional_bytes = 0;
  }
LAB_003bdb3d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return additional_bytes;
  }
  __stack_chk_fail();
}

Assistant:

size_t FlatFileSeq::Allocate(const FlatFilePos& pos, size_t add_size, bool& out_of_space) const
{
    out_of_space = false;

    unsigned int n_old_chunks = (pos.nPos + m_chunk_size - 1) / m_chunk_size;
    unsigned int n_new_chunks = (pos.nPos + add_size + m_chunk_size - 1) / m_chunk_size;
    if (n_new_chunks > n_old_chunks) {
        size_t old_size = pos.nPos;
        size_t new_size = n_new_chunks * m_chunk_size;
        size_t inc_size = new_size - old_size;

        if (CheckDiskSpace(m_dir, inc_size)) {
            FILE *file = Open(pos);
            if (file) {
                LogDebug(BCLog::VALIDATION, "Pre-allocating up to position 0x%x in %s%05u.dat\n", new_size, m_prefix, pos.nFile);
                AllocateFileRange(file, pos.nPos, inc_size);
                fclose(file);
                return inc_size;
            }
        } else {
            out_of_space = true;
        }
    }
    return 0;
}